

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O2

int __thiscall
CSnapshotDelta::CreateDelta(CSnapshotDelta *this,CSnapshot *pFrom,CSnapshot *pTo,void *pDstData)

{
  int iVar1;
  CSnapshot *this_00;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  undefined1 *puVar9;
  ushort *puVar10;
  int *piVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  bool bVar18;
  int aPastIndecies [1024];
  CItemList Hashlist [256];
  
  puVar2 = &stack0xffffffffffffffd0;
  do {
    puVar9 = puVar2;
    *(undefined8 *)(puVar9 + -0x1000) = 0;
    puVar2 = puVar9 + -0x1000;
  } while ((int *)(puVar9 + -0x1000) != aPastIndecies + 0x102);
  *(CSnapshotDelta **)(puVar9 + -0x1428) = this;
  *(undefined8 *)(puVar9 + 0x1fff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)pDstData = 0;
  piVar8 = (int *)((long)pDstData + 0xc);
  *(undefined4 *)((long)pDstData + 8) = 0;
  *(CSnapshot **)(puVar9 + -0x1440) = pTo;
  *(undefined8 *)(puVar9 + -0x1450) = 0x1bb695;
  GenerateHash((CItemList *)(puVar9 + -0x408),pTo);
  *(CSnapshot **)(puVar9 + -0x1430) = pFrom + 1;
  for (lVar16 = 0; lVar6 = (long)pFrom->m_NumItems, lVar16 < lVar6; lVar16 = lVar16 + 1) {
    iVar4 = *(int *)((long)(&pFrom[1].m_DataSize)[lVar6 + lVar16] +
                    *(long *)(puVar9 + -0x1430) + lVar6 * 8);
    *(undefined8 *)(puVar9 + -0x1450) = 0x1bb6cd;
    iVar3 = GetItemIndexHashed(iVar4,(CItemList *)(puVar9 + -0x408));
    if (iVar3 == -1) {
      *(int *)pDstData = *pDstData + 1;
      *piVar8 = iVar4;
      piVar8 = piVar8 + 1;
    }
  }
  *(CSnapshot **)(puVar9 + -0x1448) = pFrom;
  *(undefined8 *)(puVar9 + -0x1450) = 0x1bb6f5;
  GenerateHash((CItemList *)(puVar9 + -0x408),pFrom);
  lVar16 = *(long *)(puVar9 + -0x1440);
  uVar5 = *(uint *)(lVar16 + 4);
  *(long *)(puVar9 + -0x1410) = lVar16 + 8;
  lVar16 = lVar16 + (long)(int)uVar5 * 4 + 8;
  uVar15 = 0;
  uVar17 = 0;
  if (0 < (int)uVar5) {
    uVar17 = (ulong)uVar5;
  }
  for (; uVar17 != uVar15; uVar15 = uVar15 + 1) {
    iVar4 = *(int *)((long)(int)uVar5 * 4 + lVar16 + (long)*(int *)(lVar16 + uVar15 * 4));
    *(undefined8 *)(puVar9 + -0x1450) = 0x1bb744;
    iVar4 = GetItemIndexHashed(iVar4,(CItemList *)(puVar9 + -0x408));
    *(int *)(puVar9 + uVar15 * 4 + -0x1408) = iVar4;
  }
  lVar16 = *(long *)(puVar9 + -0x1448);
  *(long *)(puVar9 + -0x1418) = lVar16 + 0xc;
  *(long *)(puVar9 + -0x1420) = *(long *)(puVar9 + -0x1440) + 0xc;
  uVar15 = 0;
  *(ulong *)(puVar9 + -0x1438) = uVar17;
  do {
    if (uVar15 == uVar17) {
      if (((*pDstData == 0) && (*(int *)((long)pDstData + 4) == 0)) &&
         (*(int *)((long)pDstData + 8) == 0)) {
        iVar4 = 0;
      }
      else {
        iVar4 = (int)piVar8 - (int)pDstData;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(puVar9 + 0x1fff8)) {
        return iVar4;
      }
      *(code **)(puVar9 + -0x1450) = GenerateHash;
      __stack_chk_fail();
    }
    this_00 = *(CSnapshot **)(puVar9 + -0x1440);
    *(undefined8 *)(puVar9 + -0x1450) = 0x1bb788;
    uVar5 = CSnapshot::GetItemSize(this_00,(int)uVar15);
    lVar12 = (long)this_00->m_NumItems;
    lVar6 = *(long *)(puVar9 + -0x1410) + lVar12 * 4 + lVar12 * 4;
    lVar14 = (long)*(int *)(*(long *)(puVar9 + -0x1410) + lVar12 * 4 + uVar15 * 4);
    iVar4 = (int)*(short *)(lVar14 + 2 + lVar6);
    bVar18 = true;
    if (iVar4 < 0x40) {
      bVar18 = *(short *)(*(long *)(puVar9 + -0x1428) + (long)iVar4 * 2) == 0;
    }
    puVar10 = (ushort *)(lVar6 + lVar14);
    if (*(int *)(puVar9 + uVar15 * 4 + -0x1408) == -1) {
      *piVar8 = iVar4;
      piVar8[1] = (uint)*puVar10;
      *(undefined8 *)(puVar9 + -0x1450) = 4;
      iVar4 = (int)uVar5 / (int)*(undefined8 *)(puVar9 + -0x1450);
      uVar17 = *(ulong *)(puVar9 + -0x1438);
      if (bVar18) {
        piVar8[2] = iVar4;
        piVar8 = piVar8 + 3;
      }
      else {
        piVar8 = piVar8 + 2;
      }
      *(undefined8 *)(puVar9 + -0x1450) = 0x1bb89e;
      mem_copy(piVar8,puVar10 + 2,uVar5);
LAB_001bb89e:
      piVar8 = piVar8 + iVar4;
      *(int *)((long)pDstData + 4) = *(int *)((long)pDstData + 4) + 1;
    }
    else {
      iVar3 = *(int *)(lVar16 + 4);
      iVar1 = *(int *)(*(long *)(puVar9 + -0x1430) + (long)iVar3 * 4 +
                      (long)*(int *)(puVar9 + uVar15 * 4 + -0x1408) * 4);
      piVar11 = piVar8 + 3;
      if (!bVar18) {
        piVar11 = piVar8 + 2;
      }
      *(undefined8 *)(puVar9 + -0x1450) = 4;
      iVar4 = (int)uVar5 / (int)*(undefined8 *)(puVar9 + -0x1450);
      lVar16 = *(long *)(puVar9 + -0x1418);
      lVar6 = *(long *)(puVar9 + -0x1420);
      uVar5 = 0;
      uVar17 = *(ulong *)(puVar9 + -0x1438);
      for (lVar7 = 0; iVar4 != (int)lVar7; lVar7 = lVar7 + 1) {
        uVar13 = *(int *)(lVar14 + lVar12 * 8 + lVar6 + lVar7 * 4) -
                 *(int *)((long)iVar1 + (long)iVar3 * 8 + lVar16 + lVar7 * 4);
        piVar11[lVar7] = uVar13;
        uVar5 = uVar5 | uVar13;
      }
      if (uVar5 != 0) {
        *piVar8 = (int)(short)puVar10[1];
        piVar8[1] = (uint)*puVar10;
        *(undefined8 *)(puVar9 + -0x1450) = 8;
        lVar6 = *(long *)(puVar9 + -0x1450);
        lVar16 = *(long *)(puVar9 + -0x1448);
        if (bVar18) {
          piVar8[2] = iVar4;
          *(undefined8 *)(puVar9 + -0x1450) = 0xc;
          lVar6 = *(long *)(puVar9 + -0x1450);
        }
        piVar8 = (int *)((long)piVar8 + lVar6);
        goto LAB_001bb89e;
      }
      lVar16 = *(long *)(puVar9 + -0x1448);
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

int CSnapshotDelta::CreateDelta(const CSnapshot *pFrom, CSnapshot *pTo, void *pDstData)
{
	CData *pDelta = (CData *)pDstData;
	int *pData = (int *)pDelta->m_pData;
	int i, ItemSize, PastIndex;
	const CSnapshotItem *pFromItem;
	const CSnapshotItem *pCurItem;
	const CSnapshotItem *pPastItem;
	int SizeCount = 0;

	pDelta->m_NumDeletedItems = 0;
	pDelta->m_NumUpdateItems = 0;
	pDelta->m_NumTempItems = 0;

	CItemList Hashlist[HASHLIST_SIZE];
	GenerateHash(Hashlist, pTo);

	// pack deleted stuff
	for(i = 0; i < pFrom->NumItems(); i++)
	{
		pFromItem = pFrom->GetItem(i);
		if(GetItemIndexHashed(pFromItem->Key(), Hashlist) == -1)
		{
			// deleted
			pDelta->m_NumDeletedItems++;
			*pData = pFromItem->Key();
			pData++;
		}
	}

	GenerateHash(Hashlist, pFrom);
	int aPastIndecies[1024];

	// fetch previous indices
	// we do this as a separate pass because it helps the cache
	const int NumItems = pTo->NumItems();
	for(i = 0; i < NumItems; i++)
	{
		pCurItem = pTo->GetItem(i); // O(1) .. O(n)
		aPastIndecies[i] = GetItemIndexHashed(pCurItem->Key(), Hashlist); // O(n) .. O(n^n)
	}

	for(i = 0; i < NumItems; i++)
	{
		// do delta
		ItemSize = pTo->GetItemSize(i); // O(1) .. O(n)
		pCurItem = pTo->GetItem(i); // O(1) .. O(n)
		PastIndex = aPastIndecies[i];

		bool IncludeSize = pCurItem->Type() >= MAX_NETOBJSIZES || !m_aItemSizes[pCurItem->Type()];

		if(PastIndex != -1)
		{
			int *pItemDataDst = pData+3;

			pPastItem = pFrom->GetItem(PastIndex);

			if(!IncludeSize)
				pItemDataDst = pData+2;

			if(DiffItem(pPastItem->Data(), (int*)pCurItem->Data(), pItemDataDst, ItemSize/4))
			{

				*pData++ = pCurItem->Type();
				*pData++ = pCurItem->ID();
				if(IncludeSize)
					*pData++ = ItemSize/4;
				pData += ItemSize/4;
				pDelta->m_NumUpdateItems++;
			}
		}
		else
		{
			*pData++ = pCurItem->Type();
			*pData++ = pCurItem->ID();
			if(IncludeSize)
				*pData++ = ItemSize/4;

			mem_copy(pData, pCurItem->Data(), ItemSize);
			SizeCount += ItemSize;
			pData += ItemSize/4;
			pDelta->m_NumUpdateItems++;
		}
	}

	if(0)
	{
		dbg_msg("snapshot", "%d %d %d",
			pDelta->m_NumDeletedItems,
			pDelta->m_NumUpdateItems,
			pDelta->m_NumTempItems);
	}

	/*
	// TODO: pack temp stuff

	// finish
	//mem_copy(pDelta->offsets, deleted, pDelta->num_deleted_items*sizeof(int));
	//mem_copy(&(pDelta->offsets[pDelta->num_deleted_items]), update, pDelta->num_update_items*sizeof(int));
	//mem_copy(&(pDelta->offsets[pDelta->num_deleted_items+pDelta->num_update_items]), temp, pDelta->num_temp_items*sizeof(int));
	//mem_copy(pDelta->data_start(), data, data_size);
	//pDelta->data_size = data_size;
	* */

	if(!pDelta->m_NumDeletedItems && !pDelta->m_NumUpdateItems && !pDelta->m_NumTempItems)
		return 0;

	return (int)((char*)pData-(char*)pDstData);
}